

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateInlineFunctionDefinitions
          (FileGenerator *this,Printer *p)

{
  ulong uVar1;
  Printer *pPVar2;
  size_type sVar3;
  reference this_00;
  pointer this_01;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  ulong local_38;
  size_t i;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  FileGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "\n      #ifdef __GNUC__\n      #pragma GCC diagnostic push\n      #pragma GCC diagnostic ignored \"-Wstrict-aliasing\"\n      #endif  // __GNUC__\n  "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(p,local_28._M_len,local_28._M_str);
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    sVar3 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    pPVar2 = local_18;
    if (sVar3 <= uVar1) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"\n      $hrule_thin$\n    ");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar2,local_48._M_len,local_48._M_str);
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,local_38);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator->(this_00);
    MessageGenerator::GenerateInlineMethods(this_01,local_18);
    local_38 = local_38 + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,
             "\n      #ifdef __GNUC__\n      #pragma GCC diagnostic pop\n      #endif  // __GNUC__\n  "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(pPVar2,local_60._M_len,local_60._M_str);
  return;
}

Assistant:

void FileGenerator::GenerateInlineFunctionDefinitions(io::Printer* p) {
  // TODO remove pragmas when gcc is no longer used. Current version
  // of gcc fires a bogus error when compiled with strict-aliasing.
  p->Emit(R"(
      #ifdef __GNUC__
      #pragma GCC diagnostic push
      #pragma GCC diagnostic ignored "-Wstrict-aliasing"
      #endif  // __GNUC__
  )");

  for (size_t i = 0; i < message_generators_.size(); ++i) {
    p->Emit(R"cc(
      $hrule_thin$
    )cc");
    message_generators_[i]->GenerateInlineMethods(p);
  }

  p->Emit(R"(
      #ifdef __GNUC__
      #pragma GCC diagnostic pop
      #endif  // __GNUC__
  )");
}